

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::IO::readVector<TasGrid::IO::mode_binary_type,double,int>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,IO *this,istream *is,
          int num_entries)

{
  allocator_type local_11;
  
  ::std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)(int)is,&local_11);
  ::std::istream::read
            ((char *)this,
             (long)(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

std::vector<VecType> readVector(std::istream &is, SizeType num_entries){
    std::vector<VecType> x((size_t) num_entries);
    readVector<iomode, VecType>(is, x);
    return x;
}